

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjDecodeYUVPlanes(tjhandle handle,uchar **srcPlanes,int *strides,int subsamp,uchar *dstBuf,
                     int width,int pitch,int height,int pixelFormat,int flags)

{
  j_decompress_ptr cinfo;
  __jmp_buf_tag *__env;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 *puVar6;
  JQUANT_TBL *pJVar7;
  void *__ptr;
  JSAMPLE *pJVar8;
  JSAMPROW *ppJVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong uVar12;
  JSAMPROW pJVar13;
  uint uVar14;
  tjinstance *this;
  char *__string;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uchar *_tmpbuf_aligned;
  int *piVar19;
  long *in_FS_OFFSET;
  undefined8 uVar20;
  JDIMENSION outrow;
  JDIMENSION inrow;
  ulong local_1a0;
  __jmp_buf_tag *local_198;
  long local_190;
  ulong local_188;
  void *local_180;
  uchar *local_178;
  uchar **local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  JSAMPROW *tmpbuf [10];
  int pw [10];
  JSAMPROW *inbuf [10];
  JSAMPLE *_tmpbuf [10];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    tmpbuf[lVar5] = (JSAMPROW *)0x0;
    _tmpbuf[lVar5] = (JSAMPLE *)0x0;
    inbuf[lVar5] = (JSAMPROW *)0x0;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecodeYUVPlanes(): Instance has not been initialized for decompression",0x49);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjDecodeYUVPlanes(): Instance has not been initialized for decompression",0x49);
  }
  else if ((((((srcPlanes == (uchar **)0x0) || (0xb < (uint)pixelFormat)) || (height < 1)) ||
            ((pitch < 0 || (width < 1)))) ||
           ((dstBuf == (uchar *)0x0 || ((5 < (uint)subsamp || (*srcPlanes == (uchar *)0x0)))))) ||
          ((subsamp != 3 && ((srcPlanes[1] == (uchar *)0x0 || (srcPlanes[2] == (uchar *)0x0)))))) {
    builtin_strncpy((char *)((long)handle + 0x618),"s(): Inv",8);
    builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xb2) = 0x746e656d756772;
    in_FS_OFFSET[-0x18] = 0x766e49203a292873;
    in_FS_OFFSET[-0x17] = 0x6772612064696c61;
    in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
  }
  else {
    __env = (__jmp_buf_tag *)((long)handle + 0x528);
    local_178 = dstBuf;
    local_170 = srcPlanes;
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      local_198 = __env;
      if (pixelFormat == 0xb) {
        builtin_strncpy((char *)((long)handle + 0x638),"to CMYK ",8);
        builtin_strncpy((char *)((long)handle + 0x640),"pixels.",8);
        builtin_strncpy((char *)((long)handle + 0x628),"de YUV i",8);
        builtin_strncpy((char *)((long)handle + 0x630),"mages in",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): Can",8);
        builtin_strncpy((char *)((long)handle + 0x620),"not deco",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        in_FS_OFFSET[-0x14] = 0x204b594d43206f74;
        in_FS_OFFSET[-0x13] = 0x2e736c65786970;
        in_FS_OFFSET[-0x16] = 0x6920565559206564;
        in_FS_OFFSET[-0x15] = 0x6e6920736567616d;
        in_FS_OFFSET[-0x18] = 0x6e6143203a292873;
        in_FS_OFFSET[-0x17] = 0x6f63656420746f6e;
        in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
        in_FS_OFFSET[-0x19] = 0x656e616c50565559;
      }
      else {
        if (pitch == 0) {
          pitch = tjPixelSize[(uint)pixelFormat] * width;
        }
        *(int *)((long)handle + 0x238) = width;
        *(int *)((long)handle + 0x23c) = height;
        if ((flags & 8U) == 0) {
          if ((flags & 0x10U) != 0) {
            __string = "JSIMD_FORCESSE=1";
            goto LAB_0010eca9;
          }
          if ((flags & 0x20U) != 0) {
            __string = "JSIMD_FORCESSE2=1";
            goto LAB_0010eca9;
          }
        }
        else {
          __string = "JSIMD_FORCEMMX=1";
LAB_0010eca9:
          putenv(__string);
        }
        *(undefined4 *)(*(long *)((long)handle + 0x448) + 0x20) = 0;
        *(undefined4 *)((long)handle + 0x340) = 0;
        *(undefined8 *)((long)handle + 0x414) = 0x3f00000000;
        *(undefined8 *)((long)handle + 0x41c) = 0;
        *(undefined8 *)((long)handle + 0x24c) = 0x100000001;
        iVar2 = (uint)(subsamp != 3) * 2 + 1;
        *(int *)((long)handle + 0x3b8) = iVar2;
        *(int *)((long)handle + 0x240) = iVar2;
        *(int *)((long)handle + 0x244) = iVar2;
        puVar6 = (undefined4 *)
                 (*(code *)**(undefined8 **)((long)handle + 0x210))(cinfo,1,iVar2 * 0x60);
        *(undefined4 **)((long)handle + 0x338) = puVar6;
        uVar12 = (ulong)*(uint *)((long)handle + 0x240);
        if ((int)*(uint *)((long)handle + 0x240) < 1) {
          uVar12 = 0;
        }
        uVar17 = 0;
        while (uVar12 != uVar17) {
          uVar20 = 0x100000001;
          if (uVar17 == 0) {
            uVar20 = CONCAT44((int)(((uint)(tjMCUHeight[(uint)subsamp] >> 0x1f) >> 0x1d) +
                                   tjMCUHeight[(uint)subsamp]) >> 3,
                              (int)(((uint)(tjMCUWidth[(uint)subsamp] >> 0x1f) >> 0x1d) +
                                   tjMCUWidth[(uint)subsamp]) >> 3);
          }
          *(undefined8 *)(puVar6 + 2) = uVar20;
          puVar6[1] = (int)uVar17;
          *puVar6 = (int)(uVar17 + 1);
          uVar18 = (uint)(uVar17 != 0);
          puVar6[6] = uVar18;
          puVar6[5] = uVar18;
          puVar6[4] = uVar18;
          *(undefined4 **)((long)handle + uVar17 * 8 + 0x3c0) = puVar6;
          puVar6 = puVar6 + 0x18;
          uVar17 = uVar17 + 1;
        }
        *(undefined4 *)((long)handle + 0x330) = 8;
        for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
          if (*(long *)((long)handle + lVar5 * 8 + 0x2d0) == 0) {
            pJVar7 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
            *(JQUANT_TBL **)((long)handle + lVar5 * 8 + 0x2d0) = pJVar7;
          }
        }
        puVar10 = *(undefined8 **)((long)handle + 0x450);
        local_168 = *puVar10;
        uStack_160 = puVar10[1];
        puVar10[1] = my_read_markers;
        *puVar10 = my_reset_marker_reader;
        jpeg_read_header(cinfo,1);
        puVar10 = *(undefined8 **)((long)handle + 0x450);
        *puVar10 = local_168;
        puVar10[1] = uStack_160;
        *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[(uint)pixelFormat];
        if (((uint)flags >> 0xb & 1) != 0) {
          *(undefined4 *)((long)handle + 0x268) = 1;
        }
        *(undefined4 *)((long)handle + 0x26c) = 0;
        *(undefined4 *)((long)handle + 0x418) = 0x3f;
        jinit_master_decompress(cinfo);
        (*(code *)**(undefined8 **)((long)handle + 0x468))(cinfo);
        iVar2 = *(int *)((long)handle + 0x3a4);
        uVar18 = -iVar2 & (height + iVar2) - 1U;
        if (pitch == 0) {
          pitch = tjPixelSize[(uint)pixelFormat] * *(int *)((long)handle + 0x290);
        }
        iVar1 = *(int *)((long)handle + 0x3a0);
        __ptr = malloc((long)(int)uVar18 << 3);
        if (__ptr != (void *)0x0) {
          uVar17 = (ulong)(uint)height;
          uVar12 = (ulong)(uint)height;
          for (uVar15 = 0; uVar12 = uVar12 - 1, uVar15 != (uint)height; uVar15 = uVar15 + 1) {
            uVar16 = uVar12;
            if ((flags & 2U) == 0) {
              uVar16 = uVar15;
            }
            *(uchar **)((long)__ptr + uVar15 * 8) = local_178 + uVar16 * (long)pitch;
          }
          if (height < (int)uVar18) {
            puVar10 = (undefined8 *)(uVar17 * 8 + (long)__ptr);
            for (; height < (int)uVar18; height = height + 1) {
              *puVar10 = *(undefined8 *)((long)__ptr + uVar17 * 8 + -8);
              puVar10 = puVar10 + 1;
            }
          }
          uVar12 = 0;
          local_188 = (ulong)*(uint *)((long)handle + 0x240);
          local_180 = __ptr;
          if ((int)*(uint *)((long)handle + 0x240) < 1) {
            local_188 = uVar12;
          }
          for (; uVar12 != local_188; uVar12 = uVar12 + 1) {
            lVar5 = *(long *)((long)handle + 0x338);
            local_190 = uVar12 * 0x60;
            uVar11 = *(int *)(lVar5 + 0x1c + local_190) * 8 + 0x1fU & 0xffffffe0;
            iVar3 = *(int *)(lVar5 + 0xc + local_190);
            local_1a0 = (ulong)iVar3;
            pJVar8 = (JSAMPLE *)malloc((ulong)(iVar3 * uVar11 + 0x20));
            _tmpbuf[uVar12] = pJVar8;
            if (pJVar8 == (JSAMPLE *)0x0) {
LAB_0010f0e0:
              builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
              builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
              builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
              builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
              builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
              builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
              builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
              in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
              in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
              in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
              in_FS_OFFSET[-0x19] = 0x656e616c50565559;
              goto LAB_0010f135;
            }
            ppJVar9 = (JSAMPROW *)malloc(local_1a0 * 8);
            tmpbuf[uVar12] = ppJVar9;
            if (ppJVar9 == (JSAMPROW *)0x0) goto LAB_0010f0e0;
            uVar15 = 0;
            uVar14 = 0;
            uVar17 = 0;
            if (0 < (int)local_1a0) {
              uVar17 = local_1a0 & 0xffffffff;
            }
            for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
              ppJVar9[uVar15] =
                   (JSAMPROW)((ulong)uVar14 + ((ulong)(pJVar8 + 0x1f) & 0xffffffffffffffe0));
              uVar14 = uVar14 + uVar11;
            }
            iVar3 = (int)(*(int *)(lVar5 + local_190 + 8) * (-iVar1 & (width + iVar1) - 1U)) / iVar1
            ;
            pw[uVar12] = iVar3;
            uVar17 = (long)(int)((int)local_1a0 * uVar18) / (long)iVar2;
            iVar4 = (int)uVar17;
            uVar17 = uVar17 & 0xffffffff;
            ppJVar9 = (JSAMPROW *)malloc((long)iVar4 << 3);
            inbuf[uVar12] = ppJVar9;
            if (ppJVar9 == (JSAMPROW *)0x0) goto LAB_0010f0e0;
            pJVar13 = local_170[uVar12];
            uVar15 = 0;
            if (iVar4 < 1) {
              uVar17 = 0;
            }
            for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
              ppJVar9[uVar15] = pJVar13;
              if ((strides == (int *)0x0) || (iVar4 = strides[uVar12], strides[uVar12] == 0)) {
                iVar4 = iVar3;
              }
              pJVar13 = pJVar13 + iVar4;
            }
          }
          iVar2 = _setjmp(local_198);
          if (iVar2 == 0) {
            for (iVar2 = 0; iVar2 < (int)uVar18; iVar2 = iVar2 + *(int *)((long)handle + 0x3a4)) {
              inrow = 0;
              outrow = 0;
              piVar19 = (int *)(*(long *)((long)handle + 0x338) + 0xc);
              for (lVar5 = 0; lVar5 < *(int *)((long)handle + 0x240); lVar5 = lVar5 + 1) {
                jcopy_sample_rows(inbuf[lVar5],(*piVar19 * iVar2) / *(int *)((long)handle + 0x3a4),
                                  tmpbuf[lVar5],0,*piVar19,pw[lVar5]);
                piVar19 = piVar19 + 0x18;
              }
              (**(code **)(*(long *)((long)handle + 0x468) + 8))
                        (cinfo,tmpbuf,&inrow,*(undefined4 *)((long)handle + 0x3a4),
                         (void *)((long)local_180 + (long)iVar2 * 8),&outrow,
                         *(undefined4 *)((long)handle + 0x3a4));
            }
            jpeg_abort_decompress(cinfo);
            uVar18 = 0;
          }
          else {
LAB_0010f135:
            uVar18 = 0xffffffff;
          }
          goto LAB_0010ebcb;
        }
        builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
        builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
        builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
        in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
        in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
        in_FS_OFFSET[-0x1a] = 0x65646f6365446a74;
        in_FS_OFFSET[-0x19] = 0x656e616c50565559;
      }
    }
  }
  __ptr = (void *)0x0;
  uVar18 = 0xffffffff;
LAB_0010ebcb:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  free(__ptr);
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    free(tmpbuf[lVar5]);
    free(_tmpbuf[lVar5]);
    free(inbuf[lVar5]);
  }
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar18;
}

Assistant:

DLLEXPORT int tjDecodeYUVPlanes(tjhandle handle,
                                const unsigned char **srcPlanes,
                                const int *strides, int subsamp,
                                unsigned char *dstBuf, int width, int pitch,
                                int height, int pixelFormat, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *inbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;
  int (*old_read_markers) (j_decompress_ptr);
  void (*old_reset_marker_reader) (j_decompress_ptr);

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecodeYUVPlanes(): Instance has not been initialized for decompression");

  if (!srcPlanes || !srcPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT ||
      dstBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjDecodeYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (pixelFormat == TJPF_CMYK)
    THROW("tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels.");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];
  dinfo->image_width = width;
  dinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  dinfo->progressive_mode = dinfo->inputctl->has_multiple_scans = FALSE;
  dinfo->Ss = dinfo->Ah = dinfo->Al = 0;
  dinfo->Se = DCTSIZE2 - 1;
  if (setDecodeDefaults(dinfo, pixelFormat, subsamp, flags) == -1) {
    retval = -1;  goto bailout;
  }
  old_read_markers = dinfo->marker->read_markers;
  dinfo->marker->read_markers = my_read_markers;
  old_reset_marker_reader = dinfo->marker->reset_marker_reader;
  dinfo->marker->reset_marker_reader = my_reset_marker_reader;
  jpeg_read_header(dinfo, TRUE);
  dinfo->marker->read_markers = old_read_markers;
  dinfo->marker->reset_marker_reader = old_reset_marker_reader;

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  dinfo->do_fancy_upsampling = FALSE;
  dinfo->Se = DCTSIZE2 - 1;
  jinit_master_decompress(dinfo);
  (*dinfo->upsample->start_pass) (dinfo);

  pw0 = PAD(width, dinfo->max_h_samp_factor);
  ph0 = PAD(height, dinfo->max_v_samp_factor);

  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjDecodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < dinfo->num_components; i++) {
    compptr = &dinfo->comp_info[i];
    _tmpbuf[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] =
        &_tmpbuf_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / dinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / dinfo->max_v_samp_factor;
    inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!inbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += dinfo->max_v_samp_factor) {
    JDIMENSION inrow = 0, outrow = 0;

    for (i = 0, compptr = dinfo->comp_info; i < dinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(inbuf[i],
        row * compptr->v_samp_factor / dinfo->max_v_samp_factor, tmpbuf[i], 0,
        compptr->v_samp_factor, pw[i]);
    (dinfo->upsample->upsample) (dinfo, tmpbuf, &inrow,
                                 dinfo->max_v_samp_factor, &row_pointer[row],
                                 &outrow, dinfo->max_v_samp_factor);
  }
  jpeg_abort_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(inbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}